

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

int Acb_NtkEcoPerform(Acb_Ntk_t *pNtkF,Acb_Ntk_t *pNtkG,char **pFileName,int fCisOnly,int fInputs,
                     int fCheck,int fVerbose,int fVeryVerbose)

{
  Vec_Wec_t *vSops_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  sat_solver *s;
  abctime aVar5;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  Gia_Man_t *pGVar8;
  char *pcVar9;
  char *local_1a8;
  char *local_1a0;
  int local_154;
  Vec_Ptr_t *local_150;
  Vec_Int_t *local_148;
  int local_13c;
  int i_1;
  Gia_Man_t *pTemp_1;
  abctime clk_1;
  Vec_Int_t *pVStack_120;
  int Res;
  Vec_Int_t *vSupp_1;
  sat_solver *pSat;
  int local_108;
  int status;
  int Lit;
  int i;
  char *pSop;
  Vec_Str_t *vPatch;
  Vec_Str_t *vInst;
  Vec_Ptr_t *vGias;
  Vec_Ptr_t *vFuncs;
  Vec_Int_t *vUsed;
  Vec_Int_t *vSuppOld;
  Vec_Wec_t *vSupps;
  Vec_Ptr_t *vSops;
  Gia_Man_t *pOne;
  Gia_Man_t *pTemp;
  Cnf_Dat_t *pCnf;
  Gia_Man_t *pGiaM;
  Gia_Man_t *pGiaG;
  Gia_Man_t *pGiaF;
  Vec_Int_t *vNodesG;
  Vec_Int_t *vNodesF;
  Vec_Int_t *vDivs;
  Vec_Int_t *vSupp;
  Vec_Int_t *vSuppG;
  Vec_Int_t *vSuppF;
  Vec_Int_t *vRoots;
  Vec_Bit_t *vBlock;
  int local_40;
  int RetValue;
  int TimeOut;
  int nTargets;
  abctime clk;
  int local_28;
  int fCheck_local;
  int fInputs_local;
  int fCisOnly_local;
  char **pFileName_local;
  Acb_Ntk_t *pNtkG_local;
  Acb_Ntk_t *pNtkF_local;
  
  clk._4_4_ = fCheck;
  local_28 = fInputs;
  fCheck_local = fCisOnly;
  _fInputs_local = pFileName;
  pFileName_local = (char **)pNtkG;
  pNtkG_local = pNtkF;
  _TimeOut = Abc_Clock();
  RetValue = Vec_IntSize(&pNtkG_local->vTargets);
  local_40 = 0x78;
  if (fCheck_local != 0) {
    local_40 = 0;
  }
  vBlock._4_4_ = 1;
  vSuppF = Acb_NtkFindRoots(pNtkG_local,&pNtkG_local->vTargets,(Vec_Bit_t **)&vRoots);
  vSuppG = Acb_NtkFindSupp(pNtkG_local,vSuppF);
  vSupp = Acb_NtkFindSupp((Acb_Ntk_t *)pFileName_local,vSuppF);
  vDivs = Vec_IntTwoMerge(vSuppG,vSupp);
  if ((fCheck_local == 0) && (local_28 == 0)) {
    local_148 = Acb_NtkFindDivs(pNtkG_local,vDivs,(Vec_Bit_t *)vRoots,fVerbose);
  }
  else {
    local_148 = Acb_NtkFindDivsCis(pNtkG_local,vDivs);
  }
  vNodesF = local_148;
  vNodesG = Acb_NtkFindNodes(pNtkG_local,vSuppF,local_148);
  pGiaF = (Gia_Man_t *)Acb_NtkFindNodes((Acb_Ntk_t *)pFileName_local,vSuppF,(Vec_Int_t *)0x0);
  pGiaG = Acb_NtkToGia(pNtkG_local,vDivs,vNodesG,vSuppF,vNodesF,&pNtkG_local->vTargets);
  pGiaM = Acb_NtkToGia((Acb_Ntk_t *)pFileName_local,vDivs,(Vec_Int_t *)pGiaF,vSuppF,(Vec_Int_t *)0x0
                       ,(Vec_Int_t *)0x0);
  pCnf = (Cnf_Dat_t *)Acb_CreateMiter(pGiaG,pGiaM);
  vSupps = (Vec_Wec_t *)Vec_PtrAlloc(RetValue);
  vSuppOld = (Vec_Int_t *)Vec_WecAlloc(RetValue);
  vUsed = Vec_IntAlloc(100);
  vFuncs = (Vec_Ptr_t *)0x0;
  vGias = (Vec_Ptr_t *)0x0;
  if (fCheck_local == 0) {
    local_150 = (Vec_Ptr_t *)0x0;
  }
  else {
    local_150 = Vec_PtrAlloc(RetValue);
  }
  vInst = (Vec_Str_t *)local_150;
  vPatch = (Vec_Str_t *)0x0;
  pSop = (char *)0x0;
  _Lit = (char *)0x0;
  if (fVerbose != 0) {
    printf("The number of targets = %d.\n",(ulong)(uint)RetValue);
    printf("NtkF:  ");
    Gia_ManPrintStats(pGiaG,(Gps_Par_t *)0x0);
    printf("NtkG:  ");
    Gia_ManPrintStats(pGiaM,(Gps_Par_t *)0x0);
    printf("Miter: ");
    Gia_ManPrintStats((Gia_Man_t *)pCnf,(Gps_Par_t *)0x0);
  }
  iVar2 = RetValue;
  if (clk._4_4_ != 0) {
    pTemp = (Gia_Man_t *)Acb_NtkDeriveMiterCnf((Gia_Man_t *)pCnf,RetValue,RetValue,fVerbose);
    s = (sat_solver *)Cnf_DataWriteIntoSolver((Cnf_Dat_t *)pTemp,1,0);
    Cnf_DataFree((Cnf_Dat_t *)pTemp);
    local_108 = Abc_Var2Lit(1,0);
    iVar2 = sat_solver_addclause(s,&local_108,&status);
    if (iVar2 == 0) {
      local_154 = -1;
    }
    else {
      local_154 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,0,0,0,0);
    }
    sat_solver_delete(s);
    pcVar9 = "NO";
    if (local_154 == -1) {
      pcVar9 = "a";
    }
    printf("The ECO problem has %s solution. ",pcVar9);
    aVar5 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar5 - _TimeOut);
    iVar2 = RetValue;
    if (local_154 != -1) {
      vBlock._4_4_ = 0;
      goto LAB_0044199e;
    }
  }
  while (status = iVar2 + -1, -1 < status) {
    printf("\nConsidering target %d (out of %d)...\n",(ulong)(uint)status,(ulong)(uint)RetValue);
    if (fCheck_local == 0) {
      pGVar8 = (Gia_Man_t *)Acb_NtkDeriveMiterCnf((Gia_Man_t *)pCnf,status,RetValue,fVerbose);
      iVar1 = RetValue;
      iVar2 = status;
      pTemp = pGVar8;
      iVar4 = Vec_IntSize(vNodesF);
      pVStack_120 = Acb_DerivePatchSupport
                              ((Cnf_Dat_t *)pGVar8,iVar2,iVar1,iVar4,vNodesF,pNtkG_local,vUsed,
                               local_40);
      if (pVStack_120 == (Vec_Int_t *)0x0) {
        Cnf_DataFree((Cnf_Dat_t *)pTemp);
        vBlock._4_4_ = 0;
        goto LAB_0044199e;
      }
      Vec_IntAppend(vUsed,pVStack_120);
      Vec_IntClear(pVStack_120);
      Vec_IntAppend(pVStack_120,vUsed);
      iVar1 = RetValue;
      pGVar8 = pTemp;
      iVar2 = status;
      iVar4 = Vec_IntSize(vNodesF);
      _Lit = Acb_DeriveOnePatchFunction
                       ((Cnf_Dat_t *)pGVar8,iVar2,iVar1,iVar4,pVStack_120,fCheck_local);
      Cnf_DataFree((Cnf_Dat_t *)pTemp);
      if (_Lit == (char *)0x0) {
        vBlock._4_4_ = 0;
        goto LAB_0044199e;
      }
      vSops = (Vec_Ptr_t *)Abc_SopSynthesizeOne(_Lit,1);
      printf("Tar%02d: ",(ulong)(uint)status);
      Gia_ManPrintStats((Gia_Man_t *)vSops,(Gps_Par_t *)0x0);
      pOne = (Gia_Man_t *)pCnf;
      pCnf = (Cnf_Dat_t *)
             Acb_UpdateMiter((Gia_Man_t *)pCnf,(Gia_Man_t *)vSops,status,RetValue,pVStack_120,
                             fCheck_local);
      Gia_ManStop(pOne);
      Gia_ManStop((Gia_Man_t *)vSops);
      Vec_PtrPush((Vec_Ptr_t *)vSupps,_Lit);
      if (fVeryVerbose != 0) {
        printf("Function %d\n%s",(ulong)(uint)status,_Lit);
      }
    }
    else {
      iVar2 = Vec_IntSize(vNodesF);
      pVStack_120 = Vec_IntStartNatural(iVar2);
      iVar2 = status;
      uVar3 = Vec_IntSize(pVStack_120);
      printf("Target %d has support with %d variables.\n",(ulong)(uint)iVar2,(ulong)uVar3);
      vSops = (Vec_Ptr_t *)Acb_NtkDeriveMiterCnfInter((Gia_Man_t *)pCnf,status,RetValue);
      printf("Tar%02d: ",(ulong)(uint)status);
      Gia_ManPrintStats((Gia_Man_t *)vSops,(Gps_Par_t *)0x0);
      pOne = (Gia_Man_t *)pCnf;
      pCnf = (Cnf_Dat_t *)
             Acb_UpdateMiter((Gia_Man_t *)pCnf,(Gia_Man_t *)vSops,status,RetValue,pVStack_120,
                             fCheck_local);
      Gia_ManStop(pOne);
      Vec_PtrPush((Vec_Ptr_t *)vInst,vSops);
    }
    pVVar6 = Vec_WecPushLevel((Vec_Wec_t *)vSuppOld);
    Vec_IntAppend(pVVar6,pVStack_120);
    Vec_IntFree(pVStack_120);
    iVar2 = status;
  }
  printf("\n");
  if (fCheck_local == 0) {
    aVar5 = Abc_Clock();
    pTemp = (Gia_Man_t *)Mf_ManGenerateCnf((Gia_Man_t *)pCnf,8,0,0,0,0);
    iVar2 = Acb_CheckMiter((Cnf_Dat_t *)pTemp);
    Cnf_DataFree((Cnf_Dat_t *)pTemp);
    if (iVar2 == 1) {
      printf("The ECO solution was verified successfully.  ");
    }
    else {
      printf("The ECO solution verification FAILED.  ");
    }
    aVar7 = Abc_Clock();
    Abc_PrintTime(1,"Time",aVar7 - aVar5);
  }
  vSops_00 = vSupps;
  pVVar6 = vSuppOld;
  if (fCheck_local == 0) {
    iVar2 = Vec_IntSize(vNodesF);
    vGias = Acb_TransformPatchFunctions
                      ((Vec_Ptr_t *)vSops_00,(Vec_Wec_t *)pVVar6,(Vec_Int_t **)&vFuncs,iVar2);
    Vec_PtrReverseOrder(vGias);
  }
  else {
    iVar2 = Vec_IntSize(vNodesF);
    vFuncs = (Vec_Ptr_t *)Vec_IntStartNatural(iVar2);
    Vec_PtrReverseOrder((Vec_Ptr_t *)vInst);
  }
  vPatch = Acb_GenerateInstance(pNtkG_local,vNodesF,(Vec_Int_t *)vFuncs,&pNtkG_local->vTargets);
  pSop = (char *)Acb_GeneratePatch(pNtkG_local,vNodesF,(Vec_Int_t *)vFuncs,vGias,(Vec_Ptr_t *)vInst,
                                   &pNtkG_local->vTargets);
  Acb_PrintPatch(pNtkG_local,vNodesF,(Vec_Int_t *)vFuncs,_TimeOut);
  if (_fInputs_local[3] == (char *)0x0) {
    Acb_GenerateFilePatch((Vec_Str_t *)pSop,"patch.v");
  }
  if (_fInputs_local[3] == (char *)0x0) {
    local_1a0 = "out.v";
  }
  else {
    local_1a0 = _fInputs_local[3];
  }
  Acb_GenerateFileOut(vPatch,*_fInputs_local,local_1a0,(Vec_Str_t *)pSop);
  if (_fInputs_local[3] == (char *)0x0) {
    local_1a8 = "out.v";
  }
  else {
    local_1a8 = _fInputs_local[3];
  }
  printf("Finished dumping resulting file \"%s\".\n\n",local_1a8);
LAB_0044199e:
  if (vInst != (Vec_Str_t *)0x0) {
    for (local_13c = 0; iVar2 = Vec_PtrSize((Vec_Ptr_t *)vInst), local_13c < iVar2;
        local_13c = local_13c + 1) {
      pGVar8 = (Gia_Man_t *)Vec_PtrEntry((Vec_Ptr_t *)vInst,local_13c);
      Gia_ManStop(pGVar8);
    }
    Vec_PtrFree((Vec_Ptr_t *)vInst);
  }
  Vec_StrFreeP((Vec_Str_t **)&pSop);
  Vec_StrFreeP(&vPatch);
  Vec_PtrFreeFree((Vec_Ptr_t *)vSupps);
  Vec_WecFree((Vec_Wec_t *)vSuppOld);
  Vec_IntFree(vUsed);
  Vec_IntFreeP((Vec_Int_t **)&vFuncs);
  if (vGias != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(vGias);
  }
  Gia_ManStop(pGiaG);
  Gia_ManStop(pGiaM);
  Gia_ManStop((Gia_Man_t *)pCnf);
  Vec_IntFreeP(&vSuppG);
  Vec_IntFreeP(&vSupp);
  Vec_IntFreeP(&vDivs);
  Vec_IntFreeP(&vNodesG);
  Vec_IntFreeP((Vec_Int_t **)&pGiaF);
  Vec_IntFreeP(&vSuppF);
  Vec_IntFreeP(&vNodesF);
  Vec_BitFreeP((Vec_Bit_t **)&vRoots);
  return vBlock._4_4_;
}

Assistant:

int Acb_NtkEcoPerform( Acb_Ntk_t * pNtkF, Acb_Ntk_t * pNtkG, char * pFileName[4], int fCisOnly, int fInputs, int fCheck, int fVerbose, int fVeryVerbose )
{
    extern Gia_Man_t * Abc_SopSynthesizeOne( char * pSop, int fClp );

    abctime clk  = Abc_Clock();
    int nTargets = Vec_IntSize(&pNtkF->vTargets);
    int TimeOut  = fCisOnly ? 0 : 120;  // 60 seconds
    int RetValue = 1;

    // compute various sets of nodes
    Vec_Bit_t * vBlock;
    Vec_Int_t * vRoots  = Acb_NtkFindRoots( pNtkF, &pNtkF->vTargets, &vBlock );
    Vec_Int_t * vSuppF  = Acb_NtkFindSupp( pNtkF, vRoots );
    Vec_Int_t * vSuppG  = Acb_NtkFindSupp( pNtkG, vRoots );
    Vec_Int_t * vSupp   = Vec_IntTwoMerge( vSuppF, vSuppG );
    Vec_Int_t * vDivs   = (fCisOnly || fInputs) ? Acb_NtkFindDivsCis( pNtkF, vSupp ) : Acb_NtkFindDivs( pNtkF, vSupp, vBlock, fVerbose );
    Vec_Int_t * vNodesF = Acb_NtkFindNodes( pNtkF, vRoots, vDivs );
    Vec_Int_t * vNodesG = Acb_NtkFindNodes( pNtkG, vRoots, NULL );

    // create AIGs
    Gia_Man_t * pGiaF   = Acb_NtkToGia( pNtkF, vSupp, vNodesF, vRoots, vDivs, &pNtkF->vTargets );
    Gia_Man_t * pGiaG   = Acb_NtkToGia( pNtkG, vSupp, vNodesG, vRoots, NULL, NULL );
    Gia_Man_t * pGiaM   = Acb_CreateMiter( pGiaF, pGiaG );

    Cnf_Dat_t * pCnf;
    Gia_Man_t * pTemp, * pOne;
    Vec_Ptr_t * vSops    = Vec_PtrAlloc( nTargets );
    Vec_Wec_t * vSupps   = Vec_WecAlloc( nTargets );
    Vec_Int_t * vSuppOld = Vec_IntAlloc( 100 );

    Vec_Int_t * vUsed  = NULL; 
    Vec_Ptr_t * vFuncs = NULL;
    Vec_Ptr_t * vGias  = fCisOnly ? Vec_PtrAlloc(nTargets) : NULL;
    Vec_Str_t * vInst  = NULL, * vPatch = NULL;

    char * pSop = NULL;
    int i;

    if ( fVerbose )
    {
        printf( "The number of targets = %d.\n", nTargets );

        printf( "NtkF:  " );
        Gia_ManPrintStats( pGiaF, NULL );
        printf( "NtkG:  " );
        Gia_ManPrintStats( pGiaG, NULL );
        printf( "Miter: " );
        Gia_ManPrintStats( pGiaM, NULL );
    }

    // check that the problem has a solution
    if ( fCheck )//fCisOnly )
    {
        int Lit, status;
        sat_solver * pSat;
        pCnf = Acb_NtkDeriveMiterCnf( pGiaM, nTargets, nTargets, fVerbose );
        pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
        Cnf_DataFree( pCnf );
        // add output clause
        Lit = Abc_Var2Lit( 1, 0 );
        status = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        status = status == 0 ? l_False : sat_solver_solve( pSat, NULL, NULL, 0, 0, 0, 0 );
        sat_solver_delete( pSat );
        printf( "The ECO problem has %s solution. ", status == l_False ? "a" : "NO" );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        if ( status != l_False )
        {
            RetValue = 0;
            goto cleanup;
        }
    }

    for ( i = nTargets-1; i >= 0; i-- )
    {
        Vec_Int_t * vSupp = NULL;
        printf( "\nConsidering target %d (out of %d)...\n", i, nTargets );
        // compute support of this target
        if ( fCisOnly )
        {
            vSupp = Vec_IntStartNatural( Vec_IntSize(vDivs) );
            printf( "Target %d has support with %d variables.\n", i, Vec_IntSize(vSupp) );

            pOne = Acb_NtkDeriveMiterCnfInter( pGiaM, i, nTargets );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );

            // add to functions
            Vec_PtrPush( vGias, pOne );
        }
        else
        {
            pCnf = Acb_NtkDeriveMiterCnf( pGiaM, i, nTargets, fVerbose );
//            vSupp = Acb_DerivePatchSupportS( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, NULL, TimeOut );
            vSupp = Acb_DerivePatchSupport( pCnf, i, nTargets, Vec_IntSize(vDivs), vDivs, pNtkF, vSuppOld, TimeOut );
            if ( vSupp == NULL )
            {
                Cnf_DataFree( pCnf );
                RetValue = 0;
                goto cleanup;
            }
            Vec_IntAppend( vSuppOld, vSupp );
            Vec_IntClear( vSupp );
            Vec_IntAppend( vSupp, vSuppOld );
            //Vec_IntClear( vSuppOld );

            // derive function of this target
            pSop  = Acb_DeriveOnePatchFunction( pCnf, i, nTargets, Vec_IntSize(vDivs), vSupp, fCisOnly );
            Cnf_DataFree( pCnf );
            if ( pSop == NULL )
            {
                RetValue = 0;
                goto cleanup;
            }

            // add new function to the miter
            pOne  = Abc_SopSynthesizeOne( pSop, 1 );
            printf( "Tar%02d: ", i );
            Gia_ManPrintStats( pOne, NULL );

            // update miter
            pGiaM = Acb_UpdateMiter( pTemp = pGiaM, pOne, i, nTargets, vSupp, fCisOnly );
            Gia_ManStop( pTemp );
            Gia_ManStop( pOne );

            // add to functions
            Vec_PtrPush( vSops, pSop );
            if ( fVeryVerbose )
                printf( "Function %d\n%s", i, pSop );
        }
        // add to supports
        Vec_IntAppend( Vec_WecPushLevel(vSupps), vSupp );
        Vec_IntFree( vSupp );
    }

    // make sure the function is UNSAT
    printf( "\n" );
    if ( !fCisOnly )
    {
        int Res;
        abctime clk  = Abc_Clock();
        pCnf = (Cnf_Dat_t *)Mf_ManGenerateCnf( pGiaM, 8, 0, 0, 0, 0 );
        Res = Acb_CheckMiter( pCnf );
        Cnf_DataFree( pCnf );
        if ( Res == 1 )
            printf( "The ECO solution was verified successfully.  " );
        else
            printf( "The ECO solution verification FAILED.  " );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    }

    // derive new patch functions
    if ( fCisOnly )
    {
        vUsed = Vec_IntStartNatural( Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vGias );
    }
    else
    {
        vFuncs = Acb_TransformPatchFunctions( vSops, vSupps, &vUsed, Vec_IntSize(vDivs) );
        Vec_PtrReverseOrder( vFuncs );
    }

    // generate instance and patch
    vInst   = Acb_GenerateInstance( pNtkF, vDivs, vUsed, &pNtkF->vTargets );
    vPatch  = Acb_GeneratePatch( pNtkF, vDivs, vUsed, vFuncs, vGias, &pNtkF->vTargets );

    // print the results
    //printf( "%s", Vec_StrArray(vPatch) );
    Acb_PrintPatch( pNtkF, vDivs, vUsed, clk );

    // generate output files
    if ( pFileName[3] == NULL ) Acb_GenerateFilePatch( vPatch, "patch.v" );
    Acb_GenerateFileOut( vInst, pFileName[0], pFileName[3] ? pFileName[3] : (char *)"out.v", vPatch );
    printf( "Finished dumping resulting file \"%s\".\n\n", pFileName[3] ? pFileName[3] : "out.v" );
    //Gia_AigerWrite( pGiaG, "test.aig", 0, 0, 0 );
cleanup:
    // cleanup
    if ( vGias )
    {
        Gia_Man_t * pTemp; int i;
        Vec_PtrForEachEntry( Gia_Man_t *, vGias, pTemp, i )
            Gia_ManStop( pTemp );
        Vec_PtrFree( vGias );
    }
    Vec_StrFreeP( &vPatch );
    Vec_StrFreeP( &vInst );

    Vec_PtrFreeFree( vSops );
    Vec_WecFree( vSupps );
    Vec_IntFree( vSuppOld );
    Vec_IntFreeP( &vUsed );
    if ( vFuncs ) Vec_PtrFreeFree( vFuncs );

    Gia_ManStop( pGiaF );
    Gia_ManStop( pGiaG );
    Gia_ManStop( pGiaM );

    Vec_IntFreeP( &vSuppF );
    Vec_IntFreeP( &vSuppG );
    Vec_IntFreeP( &vSupp );
    Vec_IntFreeP( &vNodesF );
    Vec_IntFreeP( &vNodesG );
    Vec_IntFreeP( &vRoots );
    Vec_IntFreeP( &vDivs );
    Vec_BitFreeP( &vBlock );
    return RetValue;
}